

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsAppsExport.cpp
# Opt level: O3

void helicsAppFree(HelicsApp app)

{
  undefined8 local_20;
  undefined8 local_18;
  
  if ((app != (HelicsApp)0x0) && (*(int *)((long)app + 0x34) == 0x7a8f1c4d)) {
    *(undefined4 *)((long)app + 0x34) = 0;
    getMasterHolder();
    MasterObjectHolder::clearApp(local_20,*(int *)((long)app + 0x30));
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
  }
  helics::CoreFactory::cleanUpCores();
  return;
}

Assistant:

void helicsAppFree(HelicsApp app)
{
    auto* appObj = helics::getAppObject(app, nullptr);
    if (appObj != nullptr) {
        appObj->valid = 0;
        getMasterHolder()->clearApp(appObj->index);
    }

    helics::CoreFactory::cleanUpCores();
}